

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aflatin.c
# Opt level: O0

FT_Pos af_latin_compute_stem_width
                 (AF_GlyphHints hints,AF_Dimension dim,FT_Pos width,FT_Pos base_delta,
                 FT_UInt base_flags,FT_UInt stem_flags)

{
  AF_StyleMetrics_conflict pAVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  FT_Pos FVar5;
  AF_GlyphHints pAVar6;
  long lVar7;
  bool bVar8;
  long local_80;
  FT_Pos delta_1;
  FT_Pos org_dist;
  long lStack_68;
  FT_UInt ppem;
  FT_Pos bdelta;
  FT_Pos delta;
  FT_Int vertical;
  FT_Int sign;
  FT_Pos dist;
  AF_LatinAxis axis;
  AF_LatinMetrics metrics;
  FT_UInt stem_flags_local;
  FT_UInt base_flags_local;
  FT_Pos base_delta_local;
  FT_Pos width_local;
  AF_Dimension dim_local;
  AF_GlyphHints hints_local;
  
  pAVar1 = hints->metrics;
  lVar7 = (ulong)dim * 0x47c8;
  bVar8 = dim == AF_DIMENSION_VERT;
  hints_local = (AF_GlyphHints)width;
  if (((hints->other_flags & 4) != 0) && (*(char *)((long)pAVar1 + lVar7 + 0x1f8) == '\0')) {
    _vertical = (AF_GlyphHints)width;
    if (width < 0) {
      _vertical = (AF_GlyphHints)-width;
    }
    if (((bVar8) && ((hints->other_flags & 2) == 0)) ||
       ((!bVar8 && ((hints->other_flags & 1) == 0)))) {
      if ((((stem_flags & 2) == 0) || (!bVar8)) || (pAVar6 = _vertical, 0xbf < (long)_vertical)) {
        if ((base_flags & 1) == 0) {
          if ((long)_vertical < 0x38) {
            _vertical = (AF_GlyphHints)0x38;
          }
        }
        else if ((long)_vertical < 0x50) {
          _vertical = (AF_GlyphHints)0x40;
        }
        pAVar6 = _vertical;
        if (*(int *)((long)pAVar1 + lVar7 + 0x60) != 0) {
          bdelta = (long)_vertical - *(long *)((long)pAVar1 + lVar7 + 0x70);
          if (bdelta < 0) {
            bdelta = -bdelta;
          }
          if (bdelta < 0x28) {
            pAVar6 = *(AF_GlyphHints *)((long)pAVar1 + lVar7 + 0x70);
            if ((long)pAVar6 < 0x30) {
              _vertical = (AF_GlyphHints)0x30;
              pAVar6 = _vertical;
            }
          }
          else if ((long)_vertical < 0xc0) {
            uVar3 = (ulong)_vertical & 0x3f;
            uVar4 = (ulong)_vertical & 0xffffffffffffffc0;
            if (uVar3 < 10) {
              pAVar6 = (AF_GlyphHints)(uVar3 + uVar4);
            }
            else if (uVar3 < 0x20) {
              pAVar6 = (AF_GlyphHints)(uVar4 + 10);
            }
            else if (uVar3 < 0x36) {
              pAVar6 = (AF_GlyphHints)(uVar4 + 0x36);
            }
            else {
              pAVar6 = (AF_GlyphHints)(uVar3 + uVar4);
            }
          }
          else {
            lStack_68 = 0;
            if (((0 < width) && (0 < base_delta)) || ((width < 0 && (base_delta < 0)))) {
              uVar2 = (uint)(((pAVar1->scaler).face)->size->metrics).x_ppem;
              lVar7 = base_delta;
              if ((9 < uVar2) && (lVar7 = lStack_68, uVar2 < 0x1e)) {
                lVar7 = (long)(base_delta * (ulong)(0x1e - uVar2)) / 0x14;
              }
              lStack_68 = lVar7;
              if (lStack_68 < 0) {
                lStack_68 = -lStack_68;
              }
            }
            pAVar6 = (AF_GlyphHints)((long)_vertical + (0x20 - lStack_68) & 0xffffffffffffffc0);
          }
        }
      }
    }
    else {
      FVar5 = af_latin_snap_width((AF_Width)((long)pAVar1 + lVar7 + 0x68),
                                  *(FT_UInt *)((long)pAVar1 + lVar7 + 0x60),(FT_Pos)_vertical);
      if (bVar8) {
        if (FVar5 < 0x40) {
          _vertical = (AF_GlyphHints)0x40;
          pAVar6 = _vertical;
        }
        else {
          pAVar6 = (AF_GlyphHints)(FVar5 + 0x10U & 0xffffffffffffffc0);
        }
      }
      else if ((hints->other_flags & 8) == 0) {
        if (FVar5 < 0x30) {
          pAVar6 = (AF_GlyphHints)(FVar5 + 0x40 >> 1);
        }
        else if (FVar5 < 0x80) {
          pAVar6 = (AF_GlyphHints)(FVar5 + 0x16U & 0xffffffffffffffc0);
          local_80 = (long)pAVar6 - (long)_vertical;
          if (local_80 < 0) {
            local_80 = -local_80;
          }
          if ((0xf < local_80) && (pAVar6 = _vertical, (long)_vertical < 0x30)) {
            pAVar6 = (AF_GlyphHints)((long)&_vertical->contours >> 1);
          }
        }
        else {
          pAVar6 = (AF_GlyphHints)(FVar5 + 0x20U & 0xffffffffffffffc0);
        }
      }
      else if (FVar5 < 0x40) {
        _vertical = (AF_GlyphHints)0x40;
        pAVar6 = _vertical;
      }
      else {
        pAVar6 = (AF_GlyphHints)(FVar5 + 0x20U & 0xffffffffffffffc0);
      }
    }
    _vertical = pAVar6;
    if (width < 0) {
      _vertical = (AF_GlyphHints)-(long)_vertical;
    }
    hints_local = _vertical;
  }
  return (FT_Pos)hints_local;
}

Assistant:

static FT_Pos
  af_latin_compute_stem_width( AF_GlyphHints  hints,
                               AF_Dimension   dim,
                               FT_Pos         width,
                               FT_Pos         base_delta,
                               FT_UInt        base_flags,
                               FT_UInt        stem_flags )
  {
    AF_LatinMetrics  metrics  = (AF_LatinMetrics)hints->metrics;
    AF_LatinAxis     axis     = &metrics->axis[dim];
    FT_Pos           dist     = width;
    FT_Int           sign     = 0;
    FT_Int           vertical = ( dim == AF_DIMENSION_VERT );


    if ( !AF_LATIN_HINTS_DO_STEM_ADJUST( hints ) ||
         axis->extra_light                       )
      return width;

    if ( dist < 0 )
    {
      dist = -width;
      sign = 1;
    }

    if ( (  vertical && !AF_LATIN_HINTS_DO_VERT_SNAP( hints ) ) ||
         ( !vertical && !AF_LATIN_HINTS_DO_HORZ_SNAP( hints ) ) )
    {
      /* smooth hinting process: very lightly quantize the stem width */

      /* leave the widths of serifs alone */
      if ( ( stem_flags & AF_EDGE_SERIF ) &&
           vertical                       &&
           ( dist < 3 * 64 )              )
        goto Done_Width;

      else if ( base_flags & AF_EDGE_ROUND )
      {
        if ( dist < 80 )
          dist = 64;
      }
      else if ( dist < 56 )
        dist = 56;

      if ( axis->width_count > 0 )
      {
        FT_Pos  delta;


        /* compare to standard width */
        delta = dist - axis->widths[0].cur;

        if ( delta < 0 )
          delta = -delta;

        if ( delta < 40 )
        {
          dist = axis->widths[0].cur;
          if ( dist < 48 )
            dist = 48;

          goto Done_Width;
        }

        if ( dist < 3 * 64 )
        {
          delta  = dist & 63;
          dist  &= -64;

          if ( delta < 10 )
            dist += delta;

          else if ( delta < 32 )
            dist += 10;

          else if ( delta < 54 )
            dist += 54;

          else
            dist += delta;
        }
        else
        {
          /* A stem's end position depends on two values: the start        */
          /* position and the stem length.  The former gets usually        */
          /* rounded to the grid, while the latter gets rounded also if it */
          /* exceeds a certain length (see below in this function).  This  */
          /* `double rounding' can lead to a great difference to the       */
          /* original, unhinted position; this normally doesn't matter for */
          /* large PPEM values, but for small sizes it can easily make     */
          /* outlines collide.  For this reason, we adjust the stem length */
          /* by a small amount depending on the PPEM value in case the     */
          /* former and latter rounding both point into the same           */
          /* direction.                                                    */

          FT_Pos  bdelta = 0;


          if ( ( ( width > 0 ) && ( base_delta > 0 ) ) ||
               ( ( width < 0 ) && ( base_delta < 0 ) ) )
          {
            FT_UInt  ppem = metrics->root.scaler.face->size->metrics.x_ppem;


            if ( ppem < 10 )
              bdelta = base_delta;
            else if ( ppem < 30 )
              bdelta = ( base_delta * (FT_Pos)( 30 - ppem ) ) / 20;

            if ( bdelta < 0 )
              bdelta = -bdelta;
          }

          dist = ( dist - bdelta + 32 ) & ~63;
        }
      }
    }
    else
    {
      /* strong hinting process: snap the stem width to integer pixels */

      FT_Pos  org_dist = dist;


      dist = af_latin_snap_width( axis->widths, axis->width_count, dist );

      if ( vertical )
      {
        /* in the case of vertical hinting, always round */
        /* the stem heights to integer pixels            */

        if ( dist >= 64 )
          dist = ( dist + 16 ) & ~63;
        else
          dist = 64;
      }
      else
      {
        if ( AF_LATIN_HINTS_DO_MONO( hints ) )
        {
          /* monochrome horizontal hinting: snap widths to integer pixels */
          /* with a different threshold                                   */

          if ( dist < 64 )
            dist = 64;
          else
            dist = ( dist + 32 ) & ~63;
        }
        else
        {
          /* for horizontal anti-aliased hinting, we adopt a more subtle */
          /* approach: we strengthen small stems, round stems whose size */
          /* is between 1 and 2 pixels to an integer, otherwise nothing  */

          if ( dist < 48 )
            dist = ( dist + 64 ) >> 1;

          else if ( dist < 128 )
          {
            /* We only round to an integer width if the corresponding */
            /* distortion is less than 1/4 pixel.  Otherwise this     */
            /* makes everything worse since the diagonals, which are  */
            /* not hinted, appear a lot bolder or thinner than the    */
            /* vertical stems.                                        */

            FT_Pos  delta;


            dist = ( dist + 22 ) & ~63;
            delta = dist - org_dist;
            if ( delta < 0 )
              delta = -delta;

            if ( delta >= 16 )
            {
              dist = org_dist;
              if ( dist < 48 )
                dist = ( dist + 64 ) >> 1;
            }
          }
          else
            /* round otherwise to prevent color fringes in LCD mode */
            dist = ( dist + 32 ) & ~63;
        }
      }
    }

  Done_Width:
    if ( sign )
      dist = -dist;

    return dist;
  }